

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O2

Mf_Man_t * Mf_ManAlloc(Gia_Man_t *pGia,Jf_Par_t *pPars)

{
  int iVar1;
  Mf_Man_t *pMVar2;
  abctime aVar3;
  Vec_Mem_t *pVVar4;
  Mf_Obj_t *pMVar5;
  Vec_Int_t *pVVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  
  if (0xe < pPars->nCutNum - 2U) {
    __assert_fail("pPars->nCutNum > 1 && pPars->nCutNum <= MF_CUT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMf.c"
                  ,0x567,"Mf_Man_t *Mf_ManAlloc(Gia_Man_t *, Jf_Par_t *)");
  }
  if (pPars->nLutSize - 2U < 9) {
    if (pGia->pRefs != (int *)0x0) {
      free(pGia->pRefs);
      pGia->pRefs = (int *)0x0;
    }
    Vec_IntFreeP(&pGia->vMapping);
    if (pGia->pSibls != (int *)0x0) {
      Gia_ManSetPhase(pGia);
    }
    iVar7 = 0xd0;
    pMVar2 = (Mf_Man_t *)calloc(1,0xd0);
    aVar3 = Abc_Clock();
    pMVar2->clkStart = aVar3;
    pMVar2->pGia = pGia;
    pMVar2->pPars = pPars;
    if (pPars->fCutMin == 0) {
      pVVar4 = (Vec_Mem_t *)0x0;
    }
    else {
      pVVar4 = Vec_MemAllocForTT(pPars->nLutSize,iVar7);
    }
    pMVar2->vTtMem = pVVar4;
    pMVar5 = (Mf_Obj_t *)calloc((long)pGia->nObjs,0x10);
    pMVar2->pLfObjs = pMVar5;
    pMVar2->iCur = 2;
    Vec_PtrGrow(&pMVar2->vPages,0x100);
    if (pPars->fGenCnf != 0) {
      pVVar6 = &pMVar2->vCnfSizes;
      Vec_IntGrow(pVVar6,10000);
      Vec_IntPush(pVVar6,1);
      Vec_IntPush(pVVar6,2);
      Vec_IntGrow(&pMVar2->vCnfMem,10000);
    }
    pVVar6 = Vec_IntAlloc(0);
    Mf_ManSetFlowRefs(pGia,pVVar6);
    iVar7 = pVVar6->nSize;
    lVar8 = 8;
    for (lVar9 = 0; lVar9 < iVar7; lVar9 = lVar9 + 1) {
      iVar1 = Vec_IntEntry(pVVar6,(int)lVar9);
      *(float *)((long)&pMVar2->pLfObjs->iCutSet + lVar8) = (float)iVar1;
      lVar8 = lVar8 + 0x10;
    }
    Vec_IntFree(pVVar6);
    return pMVar2;
  }
  __assert_fail("pPars->nLutSize > 1 && pPars->nLutSize <= MF_LEAF_MAX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMf.c"
                ,0x568,"Mf_Man_t *Mf_ManAlloc(Gia_Man_t *, Jf_Par_t *)");
}

Assistant:

Mf_Man_t * Mf_ManAlloc( Gia_Man_t * pGia, Jf_Par_t * pPars )
{
    Mf_Man_t * p;
    Vec_Int_t * vFlowRefs;
    int i, Entry;
    assert( pPars->nCutNum > 1  && pPars->nCutNum <= MF_CUT_MAX );
    assert( pPars->nLutSize > 1 && pPars->nLutSize <= MF_LEAF_MAX );
    ABC_FREE( pGia->pRefs );
    Vec_IntFreeP( &pGia->vMapping );
    if ( Gia_ManHasChoices(pGia) )
        Gia_ManSetPhase(pGia);
    p = ABC_CALLOC( Mf_Man_t, 1 );
    p->clkStart  = Abc_Clock();
    p->pGia      = pGia;
    p->pPars     = pPars;
    p->vTtMem    = pPars->fCutMin ? Vec_MemAllocForTT( pPars->nLutSize, 0 ) : NULL;
    p->pLfObjs   = ABC_CALLOC( Mf_Obj_t, Gia_ManObjNum(pGia) );
    p->iCur      = 2;
    Vec_PtrGrow( &p->vPages, 256 );
    if ( pPars->fGenCnf )
    {
        Vec_IntGrow( &p->vCnfSizes, 10000 );
        Vec_IntPush( &p->vCnfSizes, 1 );
        Vec_IntPush( &p->vCnfSizes, 2 );
        Vec_IntGrow( &p->vCnfMem, 10000 );
    }
    vFlowRefs = Vec_IntAlloc(0);
    Mf_ManSetFlowRefs( pGia, vFlowRefs );
    Vec_IntForEachEntry( vFlowRefs, Entry, i )
        p->pLfObjs[i].nFlowRefs = Entry;
    Vec_IntFree(vFlowRefs);
    return p;
}